

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl,
          cmGeneratorTarget *head,LinkInterfaceFor implFor)

{
  pointer pcVar1;
  size_t __n;
  cmGeneratorTarget *pcVar2;
  cmLinkImplItem *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  size_type sVar7;
  undefined8 uVar8;
  PolicyStatus PVar9;
  int iVar10;
  int iVar11;
  string *psVar12;
  cmTarget *this_01;
  string *psVar13;
  uint7 uVar21;
  ostream *poVar14;
  cmSourceFile *this_02;
  cmake *pcVar15;
  cmValue cVar16;
  _Rb_tree_node_base *p_Var17;
  iterator iVar18;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var19;
  LinkLibraryVectorType *pLVar20;
  PolicyID id;
  pointer item_00;
  cmLinkImplItem *pcVar22;
  iterator __first;
  cmLinkImplItem *item_1;
  cmGeneratorTarget *pcVar23;
  long lVar24;
  bool bVar25;
  cmBTStringRange cVar26;
  string_view arg;
  bool checkCMP0027;
  string name_1;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  cmLocalGenerator *lg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  llibs;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmLinkItem item;
  bool local_3f1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_3f0;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *local_3e8;
  undefined4 local_3dc;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_3d8;
  cmGeneratorExpression local_3a8;
  LinkInterfaceFor local_398;
  MessageType local_394;
  string local_390;
  cmGlobalGenerator *local_370;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_368;
  size_t local_360;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358;
  cmGeneratorTarget *local_348;
  cmGeneratorTarget *local_340;
  undefined1 local_338 [24];
  cmGlobalGenerator *pcStack_320;
  _Alloc_hider local_318;
  cmLocalGenerator *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f8 [24];
  _Base_ptr local_2e0;
  string local_2d8;
  undefined1 local_2b8 [32];
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *local_298;
  _Base_ptr local_290;
  cmMakefile *local_288;
  _Base_ptr local_280;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_278;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_270;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  size_t local_248 [2];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [80];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  bool local_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  undefined1 local_158 [32];
  _Base_ptr local_138;
  undefined1 local_130 [16];
  _Base_ptr local_120;
  __node_base local_118;
  _Base_ptr p_Stack_110;
  float local_108;
  _Base_ptr local_100;
  __node_base_ptr ap_Stack_f8 [25];
  
  local_310 = this->LocalGenerator;
  local_288 = local_310->Makefile;
  local_3e8 = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)impl;
  local_398 = implFor;
  local_318._M_p = (pointer)head;
  cVar26 = cmTarget::GetLinkImplementationEntries_abi_cxx11_(this->Target);
  if (cVar26.Begin._M_current._M_current != cVar26.End._M_current._M_current) {
    local_3a8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->PolicyMap;
    local_280 = (_Base_ptr)&this->LinkerLanguage;
    local_298 = (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)
                ((long)&(local_3e8->Value).field_2 + 8);
    local_270 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&this->LinkImplicitNullProperties;
    local_290 = (_Base_ptr)&this->MaxLanguageStandards;
    local_370 = (cmGlobalGenerator *)config;
    do {
      local_278 = cVar26.End._M_current;
      local_3f0 = cVar26.Begin._M_current;
      local_2b8._0_8_ = (string *)0x0;
      local_2b8._8_8_ = (string *)0x0;
      local_2b8._16_8_ = (pointer)0x0;
      local_2d8.field_2._8_6_ = 0x534549524152;
      local_2d8.field_2._M_allocated_capacity._0_6_ = 0x4c5f4b4e494c;
      local_2d8.field_2._M_allocated_capacity._6_2_ = 0x4249;
      local_2d8._M_string_length = 0xe;
      local_2d8.field_2._M_local_buf[0xe] = '\0';
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                ((cmGeneratorExpressionDAGChecker *)local_238,this,&local_2d8,
                 (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        CONCAT26(local_2d8.field_2._M_allocated_capacity._6_2_,
                                 local_2d8.field_2._M_allocated_capacity._0_6_) + 1);
      }
      if ((local_398 == Usage) &&
         (PVar9 = cmPolicies::PolicyMap::Get
                            ((PolicyMap *)
                             local_3a8.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,CMP0131), PVar9 - NEW < 3)) {
        local_1bc = true;
      }
      local_2f8._16_8_ =
           ((local_3f0._M_current)->Backtrace).
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_2e0 = (_Base_ptr)
                  ((local_3f0._M_current)->Backtrace).
                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
      if (local_2e0 != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&local_2e0->_M_parent = *(int *)&local_2e0->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&local_2e0->_M_parent = *(int *)&local_2e0->_M_parent + 1;
        }
      }
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_268,(cmListFileBacktrace *)(local_2f8 + 0x10));
      if (local_2e0 != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e0);
      }
      pcVar1 = ((local_3f0._M_current)->Value)._M_dataplus._M_p;
      local_258._M_allocated_capacity = (size_type)local_248;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_268 + 0x10),pcVar1,
                 pcVar1 + ((local_3f0._M_current)->Value)._M_string_length);
      cmGeneratorExpression::Parse(&local_3a8,(string *)local_268);
      if ((size_t *)local_258._M_allocated_capacity != local_248) {
        operator_delete((void *)local_258._M_allocated_capacity,local_248[0] + 1);
      }
      *(bool *)((long)local_3a8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + 0x49) = true;
      psVar12 = cmCompiledGeneratorExpression::Evaluate
                          ((cmCompiledGeneratorExpression *)
                           local_3a8.Backtrace.
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,this->LocalGenerator,config,(cmGeneratorTarget *)local_318._M_p,
                           (cmGeneratorExpressionDAGChecker *)local_238,(cmGeneratorTarget *)0x0,
                           (string *)local_280);
      __n = psVar12->_M_string_length;
      bVar25 = true;
      if (__n == ((local_3f0._M_current)->Value)._M_string_length) {
        if (__n == 0) {
          bVar25 = false;
        }
        else {
          iVar10 = bcmp((psVar12->_M_dataplus)._M_p,((local_3f0._M_current)->Value)._M_dataplus._M_p
                        ,__n);
          bVar25 = iVar10 != 0;
        }
      }
      arg._M_str = (psVar12->_M_dataplus)._M_p;
      arg._M_len = __n;
      local_3f1 = bVar25;
      cmExpandList(arg,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_2b8,false);
      uVar8 = local_2b8._8_8_;
      if (*(bool *)((long)local_3a8.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x131) == true) {
        local_3e8[3].Value.field_2._M_local_buf[3] = '\x01';
      }
      if (*(bool *)((long)local_3a8.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x130) == true) {
        local_3e8[1].Value.field_2._M_local_buf[8] = '\x01';
      }
      psVar12 = (string *)local_2b8._0_8_;
      if (*(bool *)((long)local_3a8.Backtrace.
                          super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + 0x132) == true) {
        local_3e8[3].Value.field_2._M_local_buf[0] = '\x01';
      }
      for (; psVar12 != (string *)uVar8; psVar12 = psVar12 + 1) {
        bVar25 = IsLinkLookupScope(this,psVar12,&local_310);
        iVar10 = 6;
        if (!bVar25) {
          CheckCMP0004(&local_390,this,psVar12);
          PVar9 = cmPolicies::PolicyMap::Get
                            ((PolicyMap *)
                             local_3a8.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi,CMP0108);
          if ((PVar9 == NEW) &&
             (this_01 = cmMakefile::FindTargetToUse(this->Makefile,&local_390,false),
             this_01 != (cmTarget *)0x0)) {
            cmTarget::GetName_abi_cxx11_(this_01);
            std::__cxx11::string::_M_assign((string *)&local_390);
          }
          psVar13 = cmTarget::GetName_abi_cxx11_(this->Target);
          sVar7 = local_390._M_string_length;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_390._M_string_length ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              psVar13->_M_string_length) {
            if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_390._M_string_length !=
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
               (iVar10 = bcmp(local_390._M_dataplus._M_p,(psVar13->_M_dataplus)._M_p,
                              local_390._M_string_length), iVar10 != 0)) goto LAB_004c4872;
LAB_004c478f:
            psVar13 = cmTarget::GetName_abi_cxx11_(this->Target);
            iVar10 = 6;
            if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_390._M_string_length ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 psVar13->_M_string_length) &&
               (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_390._M_string_length ==
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 ||
                (iVar11 = bcmp(local_390._M_dataplus._M_p,(psVar13->_M_dataplus)._M_p,
                               local_390._M_string_length), iVar11 == 0)))) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              PVar9 = cmPolicies::PolicyMap::Get
                                ((PolicyMap *)
                                 local_3a8.Backtrace.
                                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry
                                 .
                                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi,CMP0038);
              local_394 = FATAL_ERROR;
              uVar21 = (uint7)(uint3)(PVar9 >> 8);
              if (PVar9 == OLD) {
                local_3dc = (undefined4)CONCAT71(uVar21,1);
                bVar25 = true;
              }
              else {
                if (PVar9 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_3d8.Value,(cmPolicies *)0x26,id);
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_1a8,local_3d8.Value._M_dataplus._M_p,
                                       local_3d8.Value._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\n",1);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3d8.Value._M_dataplus._M_p != &local_3d8.Value.field_2) {
                    operator_delete(local_3d8.Value._M_dataplus._M_p,
                                    local_3d8.Value.field_2._M_allocated_capacity + 1);
                  }
                  local_3dc = 0;
                  local_394 = AUTHOR_WARNING;
                }
                else {
                  local_3dc = (undefined4)CONCAT71(uVar21,1);
                }
                bVar25 = false;
              }
              if (!bVar25) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Target \"",8);
                psVar13 = cmTarget::GetName_abi_cxx11_(this->Target);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_1a8,(psVar13->_M_dataplus)._M_p,
                                     psVar13->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\" links to itself.",0x12);
                pcVar15 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
                std::__cxx11::stringbuf::str();
                GetBacktrace((cmGeneratorTarget *)local_1b8);
                cmake::IssueMessage(pcVar15,local_394,&local_3d8.Value,
                                    (cmListFileBacktrace *)local_1b8);
                if ((cmMakefile *)local_1b8._8_8_ != (cmMakefile *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d8.Value._M_dataplus._M_p != &local_3d8.Value.field_2) {
                  operator_delete(local_3d8.Value._M_dataplus._M_p,
                                  local_3d8.Value.field_2._M_allocated_capacity + 1);
                }
                if ((char)local_3dc != '\0') {
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  std::ios_base::~ios_base((ios_base *)&local_138);
                  iVar10 = 1;
                  goto LAB_004c4c1f;
                }
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)&local_138);
            }
          }
          else {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_390._M_string_length ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
            goto LAB_004c478f;
LAB_004c4872:
            local_368 = &local_358;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_368,local_390._M_dataplus._M_p,
                       local_390._M_dataplus._M_p + (long)(_Alloc_hider *)sVar7);
            local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = ((local_3f0._M_current)->Backtrace).
                      super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 ((local_3f0._M_current)->Backtrace).
                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
            local_3d8.Value._M_dataplus._M_p = (pointer)&local_3d8.Value.field_2;
            if (local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                 TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_use_count =
                     (local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            if (local_368 == &local_358) {
              local_3d8.Value.field_2._8_8_ = local_358._8_8_;
            }
            else {
              local_3d8.Value._M_dataplus._M_p = (pointer)local_368;
            }
            local_3d8.Value.field_2._M_allocated_capacity._1_7_ =
                 local_358._M_allocated_capacity._1_7_;
            local_3d8.Value.field_2._M_local_buf[0] = local_358._M_local_buf[0];
            local_3d8.Value._M_string_length = local_360;
            local_360 = 0;
            local_358._M_local_buf[0] = '\0';
            local_368 = &local_358;
            ResolveLinkItem((cmLinkItem *)local_1a8,this,&local_3d8,local_310);
            if (local_3d8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_3d8.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8.Value._M_dataplus._M_p != &local_3d8.Value.field_2) {
              operator_delete(local_3d8.Value._M_dataplus._M_p,
                              local_3d8.Value.field_2._M_allocated_capacity + 1);
            }
            if (local_368 != &local_358) {
              operator_delete(local_368,
                              CONCAT71(local_358._M_allocated_capacity._1_7_,
                                       local_358._M_local_buf[0]) + 1);
            }
            if ((cmGeneratorTarget *)local_188._0_8_ == (cmGeneratorTarget *)0x0) {
              psVar13 = cmLinkItem::AsStr_abi_cxx11_((cmLinkItem *)local_1a8);
              bVar25 = cmsys::SystemTools::FileIsFullPath(psVar13);
              if (bVar25) {
                this_02 = cmMakefile::GetSource(local_288,psVar13,Known);
                if (this_02 == (cmSourceFile *)0x0) {
                  bVar25 = false;
                }
                else {
                  local_308._M_allocated_capacity = (size_type)local_2f8;
                  local_2f8._8_7_ = 0x5443454a424f5f;
                  local_2f8._0_7_ = 0x414e5245545845;
                  local_2f8[7] = 0x4c;
                  local_308._8_8_ = 0xf;
                  local_2f8[0xf] = 0;
                  bVar25 = cmSourceFile::GetPropertyAsBool(this_02,(string *)&local_308);
                  if ((undefined1 *)local_308._M_allocated_capacity != local_2f8) {
                    operator_delete((void *)local_308._M_allocated_capacity,
                                    CONCAT17(local_2f8[7],local_2f8._0_7_) + 1);
                  }
                }
                if (bVar25 == false) goto LAB_004c4bdc;
                iVar10 = 6;
                std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                          (local_298,(cmLinkItem *)local_1a8);
              }
              else {
LAB_004c4bdc:
                iVar10 = 0;
              }
              if (iVar10 == 0) goto LAB_004c49a5;
            }
            else {
LAB_004c49a5:
              iVar10 = 0;
              std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>::
              emplace_back<cmLinkItem,bool_const&>
                        ((vector<cmLinkImplItem,std::allocator<cmLinkImplItem>> *)local_3e8,
                         (cmLinkItem *)local_1a8,&local_3f1);
            }
            if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,
                              CONCAT44(local_198._M_allocated_capacity._4_4_,
                                       local_198._M_allocated_capacity._0_4_) + 1);
            }
          }
LAB_004c4c1f:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390._M_dataplus._M_p != &local_390.field_2) {
            operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
          }
        }
        if ((iVar10 != 6) && (iVar10 != 0)) goto LAB_004c4c5b;
      }
      iVar10 = 5;
LAB_004c4c5b:
      config = (string *)local_370;
      if (iVar10 == 5) {
        psVar6 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)local_3a8.Backtrace.
                           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr + 0xb0);
        for (p_Var17 = (((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)local_3a8.Backtrace.
                                   super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                   TopEntry.
                                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + 0xb0))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var17 != &(psVar6->_M_t)._M_impl.super__Rb_tree_header;
            p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
          cVar16 = GetProperty(this,(string *)(p_Var17 + 1));
          if (cVar16.Value == (string *)0x0) {
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      (local_270,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var17 + 1));
          }
        }
        iVar10 = 0;
        cmCompiledGeneratorExpression::GetMaxLanguageStandard
                  ((cmCompiledGeneratorExpression *)
                   local_3a8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                   TopEntry.
                   super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr,this,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_290);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)&local_3a8);
      cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_268);
      if (local_1c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c8._M_pi);
      }
      std::
      _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)(local_218 + 0x10));
      if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
        operator_delete((void *)local_228._0_8_,local_218._0_8_ + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_2b8);
      if (iVar10 != 0) goto LAB_004c4d65;
      local_3f0._M_current = local_3f0._M_current + 1;
      cVar26.End._M_current = local_278._M_current;
      cVar26.Begin._M_current = local_3f0._M_current;
    } while (local_3f0._M_current != local_278._M_current);
    iVar10 = 2;
LAB_004c4d65:
    cVar26.End._M_current = local_278._M_current;
    cVar26.Begin._M_current = local_3f0._M_current;
    if (iVar10 != 2) {
      return;
    }
  }
  if ((cmGeneratorTarget *)local_318._M_p != this) goto LAB_004c50c9;
  local_170._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8);
  local_198._M_allocated_capacity._0_4_ = local_398;
  local_198._8_8_ = local_3e8;
  local_188._8_4_ = 0;
  local_178._M_p = (pointer)0x0;
  local_168._8_8_ = (_Base_ptr)0x0;
  local_158._24_8_ = local_158 + 8;
  local_158._8_4_ = _S_red;
  local_158._16_8_ = (_Base_ptr)0x0;
  local_130._0_8_ = 0;
  local_130._8_8_ = ap_Stack_f8;
  local_120 = (_Base_ptr)&DAT_00000001;
  local_118._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_110 = (_Base_ptr)0x0;
  local_108 = 1.0;
  local_100 = (_Base_ptr)0x0;
  ap_Stack_f8[0] = (__node_base_ptr)0x0;
  pcVar23 = (cmGeneratorTarget *)
            (((_Vector_impl *)&(local_3e8->Value)._M_dataplus)->super__Vector_impl_data)._M_start;
  pcVar2 = (cmGeneratorTarget *)(local_3e8->Value)._M_string_length;
  local_228._0_8_ = (local_3e8->Value).field_2._M_allocated_capacity;
  (local_3e8->Value).field_2._M_allocated_capacity = 0;
  (((_Vector_impl *)&(local_3e8->Value)._M_dataplus)->super__Vector_impl_data)._M_start =
       (pointer)0x0;
  (local_3e8->Value)._M_string_length = 0;
  local_238._0_8_ = pcVar23;
  local_238._8_8_ = pcVar2;
  local_1a8._0_8_ = this;
  local_1a8._8_8_ = config;
  local_168._M_allocated_capacity = (size_type)local_170._M_pi;
  local_138 = (_Base_ptr)local_158._24_8_;
  while( true ) {
    uVar8 = local_238._8_8_;
    local_278 = cVar26.End._M_current;
    local_3f0 = cVar26.Begin._M_current;
    if (pcVar23 == pcVar2) break;
    std::
    _Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
    ::_M_emplace_unique<cmLinkImplItem_const&>
              ((_Rb_tree<cmLinkItem,cmLinkItem,std::_Identity<cmLinkItem>,std::less<cmLinkItem>,std::allocator<cmLinkItem>>
                *)local_188,(cmLinkImplItem *)pcVar23);
    cVar26.End._M_current = local_278._M_current;
    cVar26.Begin._M_current = local_3f0._M_current;
    pcVar23 = (cmGeneratorTarget *)&(pcVar23->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
  }
  if (local_238._0_8_ != local_238._8_8_) {
    pcVar23 = (cmGeneratorTarget *)local_238._0_8_;
    do {
      local_278 = cVar26.End._M_current;
      local_3f0 = cVar26.Begin._M_current;
      anon_unknown.dwarf_1df8047::TransitiveLinkImpl::Follow
                ((TransitiveLinkImpl *)local_1a8,
                 (cmGeneratorTarget *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&pcVar23->ObjectDirectory)->_M_allocated_capacity);
      std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::emplace_back<cmLinkImplItem>
                ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_198._8_8_,
                 (cmLinkImplItem *)pcVar23);
      cVar26.End._M_current = local_278._M_current;
      cVar26.Begin._M_current = local_3f0._M_current;
      pcVar23 = (cmGeneratorTarget *)&(pcVar23->CompileInfoMap)._M_t._M_impl.super__Rb_tree_header;
    } while (pcVar23 != (cmGeneratorTarget *)uVar8);
  }
  pcVar22 = *(cmLinkImplItem **)local_198._8_8_;
  local_3f0._M_current =
       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
       local_198._8_8_;
  pcVar3 = *(cmLinkImplItem **)(local_198._8_8_ + 8);
  lVar24 = ((long)pcVar3 - (long)pcVar22 >> 3) * -0x71c71c71c71c71c7 >> 2;
  local_370 = (cmGlobalGenerator *)config;
  if (0 < lVar24) {
    lVar24 = lVar24 + 1;
    do {
      iVar18 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar22->super_cmLinkItem);
      __first._M_current = pcVar22;
      if (iVar18._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_004c4fee;
      iVar18 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar22[1].super_cmLinkItem);
      __first._M_current = pcVar22 + 1;
      if (iVar18._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_004c4fee;
      iVar18 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar22[2].super_cmLinkItem);
      __first._M_current = pcVar22 + 2;
      if (iVar18._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_004c4fee;
      iVar18 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar22[3].super_cmLinkItem);
      __first._M_current = pcVar22 + 3;
      if (iVar18._M_node != (_Base_ptr)(local_158 + 8)) goto LAB_004c4fee;
      pcVar22 = pcVar22 + 4;
      lVar24 = lVar24 + -1;
    } while (1 < lVar24);
  }
  lVar24 = ((long)pcVar3 - (long)pcVar22 >> 3) * -0x71c71c71c71c71c7;
  if (lVar24 == 1) {
LAB_004c4fcc:
    iVar18 = std::
             _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
             ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                     *)local_158,&pcVar22->super_cmLinkItem);
    __first._M_current = pcVar22;
    if (iVar18._M_node == (_Base_ptr)(local_158 + 8)) {
      __first._M_current = pcVar3;
    }
  }
  else if (lVar24 == 2) {
LAB_004c4fab:
    iVar18 = std::
             _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
             ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                     *)local_158,&pcVar22->super_cmLinkItem);
    __first._M_current = pcVar22;
    if (iVar18._M_node == (_Base_ptr)(local_158 + 8)) {
      pcVar22 = pcVar22 + 1;
      goto LAB_004c4fcc;
    }
  }
  else {
    __first._M_current = pcVar3;
    if ((lVar24 == 3) &&
       (iVar18 = std::
                 _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                 ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                         *)local_158,&pcVar22->super_cmLinkItem), __first._M_current = pcVar22,
       iVar18._M_node == (_Base_ptr)(local_158 + 8))) {
      pcVar22 = pcVar22 + 1;
      goto LAB_004c4fab;
    }
  }
LAB_004c4fee:
  if ((__first._M_current != pcVar3) && (pcVar22 = __first._M_current + 1, pcVar22 != pcVar3)) {
    do {
      iVar18 = std::
               _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               ::find((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
                       *)local_158,&pcVar22->super_cmLinkItem);
      if (iVar18._M_node == (_Base_ptr)(local_158 + 8)) {
        std::__cxx11::string::operator=((string *)__first._M_current,(string *)pcVar22);
        ((__first._M_current)->super_cmLinkItem).Target = (pcVar22->super_cmLinkItem).Target;
        ((__first._M_current)->super_cmLinkItem).Cross = (pcVar22->super_cmLinkItem).Cross;
        peVar4 = (pcVar22->super_cmLinkItem).Backtrace.
                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var5 = (pcVar22->super_cmLinkItem).Backtrace.
                 super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                 super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        (pcVar22->super_cmLinkItem).Backtrace.
        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        (pcVar22->super_cmLinkItem).Backtrace.
        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = ((__first._M_current)->super_cmLinkItem).Backtrace.
                  super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
        ((__first._M_current)->super_cmLinkItem).Backtrace.
        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = peVar4;
        ((__first._M_current)->super_cmLinkItem).Backtrace.
        super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = p_Var5;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        (__first._M_current)->CheckCMP0027 = pcVar22->CheckCMP0027;
        __first._M_current = __first._M_current + 1;
      }
      pcVar22 = pcVar22 + 1;
    } while (pcVar22 != pcVar3);
  }
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::_M_erase
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_3f0._M_current,__first
             ,*(cmLinkImplItem **)(local_198._8_8_ + 8));
  std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector
            ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)local_238);
  std::
  _Hashtable<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>,_std::__detail::_Identity,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_cmGeneratorTarget_*,_const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>,_std::__detail::_Identity,_std::equal_to<const_cmGeneratorTarget_*>,_std::hash<const_cmGeneratorTarget_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)(local_130 + 8));
  std::
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  ::~_Rb_tree((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               *)local_158);
  std::
  _Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
  ::~_Rb_tree((_Rb_tree<cmLinkItem,_cmLinkItem,_std::_Identity<cmLinkItem>,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>
               *)local_188);
  cVar26.End._M_current = local_278._M_current;
  cVar26.Begin._M_current = local_3f0._M_current;
  config = (string *)local_370;
LAB_004c50c9:
  local_278 = cVar26.End._M_current;
  local_3f0 = cVar26.Begin._M_current;
  pcVar15 = cmMakefile::GetCMakeInstance(this->Makefile);
  cmake::GetDebugConfigs_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_390,pcVar15);
  if ((((cmGlobalGenerator *)config)->TryCompileTimeout).__r == 0.0) {
    local_3f0._M_current._0_4_ = OPTIMIZED_LibraryType;
  }
  else {
    cmsys::SystemTools::UpperCase((string *)local_1a8,config);
    _Var19 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (local_390._M_dataplus._M_p,local_390._M_string_length,local_1a8);
    local_3f0._M_current._0_4_ =
         (uint)(_Var19._M_current ==
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               local_390._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ != &local_198) {
      operator_delete((void *)local_1a8._0_8_,
                      CONCAT44(local_198._M_allocated_capacity._4_4_,
                               local_198._M_allocated_capacity._0_4_) + 1);
    }
    local_3f0._M_current._0_4_ = (cmTargetLinkLibraryType)local_3f0._M_current + DEBUG_LibraryType;
  }
  pLVar20 = cmTarget::GetOriginalLinkLibraries_abi_cxx11_(this->Target);
  item_00 = (pLVar20->
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_3a8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (pLVar20->
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetLinkLibraryType>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (item_00 !=
      (pointer)local_3a8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
               TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi) {
    local_3e8 = local_3e8 + 1;
    local_3f0._M_current._0_4_ = ~(cmTargetLinkLibraryType)local_3f0._M_current;
    do {
      if ((item_00->second & (cmTargetLinkLibraryType)local_3f0._M_current) != GENERAL_LibraryType)
      {
        CheckCMP0004(&local_3d8.Value,this,&item_00->first);
        psVar12 = cmTarget::GetName_abi_cxx11_(this->Target);
        sVar7 = local_3d8.Value._M_string_length;
        if (local_3d8.Value._M_string_length == psVar12->_M_string_length) {
          if ((local_3d8.Value._M_string_length != 0) &&
             (iVar10 = bcmp(local_3d8.Value._M_dataplus._M_p,(psVar12->_M_dataplus)._M_p,
                            local_3d8.Value._M_string_length), iVar10 != 0)) {
LAB_004c5202:
            local_348 = (cmGeneratorTarget *)local_338;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_348,local_3d8.Value._M_dataplus._M_p,
                       local_3d8.Value._M_dataplus._M_p + sVar7);
            local_338._16_8_ = (cmLocalGenerator *)0x0;
            pcStack_320 = (cmGlobalGenerator *)0x0;
            cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                      ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_338 + 0x10));
            if (local_348 == (cmGeneratorTarget *)local_338) {
              local_228._8_8_ = local_338._8_8_;
              local_238._0_8_ = (cmGeneratorTarget *)local_228;
            }
            else {
              local_238._0_8_ = local_348;
            }
            local_228._1_7_ = local_338._1_7_;
            local_228[0] = local_338[0];
            local_238._8_8_ = local_340;
            local_340 = (cmGeneratorTarget *)0x0;
            local_338[0] = 0;
            local_218._0_8_ = local_338._16_8_;
            local_218._8_8_ = pcStack_320;
            local_338._16_8_ = (cmLocalGenerator *)0x0;
            pcStack_320 = (cmGlobalGenerator *)0x0;
            local_348 = (cmGeneratorTarget *)local_338;
            ResolveLinkItem((cmLinkItem *)local_1a8,this,
                            (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_238,this->LocalGenerator);
            std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::emplace_back<cmLinkItem>
                      ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)local_3e8,
                       (cmLinkItem *)local_1a8);
            if (local_170._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_170._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._0_8_ != &local_198) {
              operator_delete((void *)local_1a8._0_8_,
                              CONCAT44(local_198._M_allocated_capacity._4_4_,
                                       local_198._M_allocated_capacity._0_4_) + 1);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
            }
            if ((cmGeneratorTarget *)local_238._0_8_ != (cmGeneratorTarget *)local_228) {
              operator_delete((void *)local_238._0_8_,(ulong)(local_228._0_8_ + 1));
            }
            if (pcStack_320 != (cmGlobalGenerator *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcStack_320);
            }
            if (local_348 != (cmGeneratorTarget *)local_338) {
              operator_delete(local_348,CONCAT71(local_338._1_7_,local_338[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3d8.Value._M_dataplus._M_p != &local_3d8.Value.field_2) {
              operator_delete(local_3d8.Value._M_dataplus._M_p,
                              local_3d8.Value.field_2._M_allocated_capacity + 1);
            }
            goto LAB_004c539c;
          }
        }
        else if (local_3d8.Value._M_string_length != 0) goto LAB_004c5202;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8.Value._M_dataplus._M_p != &local_3d8.Value.field_2) {
          operator_delete(local_3d8.Value._M_dataplus._M_p,
                          local_3d8.Value.field_2._M_allocated_capacity + 1);
        }
      }
LAB_004c539c:
      item_00 = item_00 + 1;
    } while (item_00 !=
             (pointer)local_3a8.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>
                      .TopEntry.
                      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_390);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl,
  cmGeneratorTarget const* head, LinkInterfaceFor implFor) const
{
  cmLocalGenerator const* lg = this->LocalGenerator;
  cmMakefile const* mf = lg->GetMakefile();
  cmBTStringRange entryRange = this->Target->GetLinkImplementationEntries();
  // Collect libraries directly linked in this configuration.
  for (auto const& entry : entryRange) {
    std::vector<std::string> llibs;
    // Keep this logic in sync with ExpandLinkItems.
    cmGeneratorExpressionDAGChecker dagChecker(this, "LINK_LIBRARIES", nullptr,
                                               nullptr);
    // The $<LINK_ONLY> expression may be used to specify link dependencies
    // that are otherwise excluded from usage requirements.
    if (implFor == LinkInterfaceFor::Usage) {
      switch (this->GetPolicyStatusCMP0131()) {
        case cmPolicies::WARN:
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          dagChecker.SetTransitivePropertiesOnly();
          break;
      }
    }
    cmGeneratorExpression ge(entry.Backtrace);
    std::unique_ptr<cmCompiledGeneratorExpression> const cge =
      ge.Parse(entry.Value);
    cge->SetEvaluateForBuildsystem(true);
    std::string const& evaluated =
      cge->Evaluate(this->LocalGenerator, config, head, &dagChecker, nullptr,
                    this->LinkerLanguage);
    bool const checkCMP0027 = evaluated != entry.Value;
    cmExpandList(evaluated, llibs);
    if (cge->GetHadHeadSensitiveCondition()) {
      impl.HadHeadSensitiveCondition = true;
    }
    if (cge->GetHadContextSensitiveCondition()) {
      impl.HadContextSensitiveCondition = true;
    }
    if (cge->GetHadLinkLanguageSensitiveCondition()) {
      impl.HadLinkLanguageSensitiveCondition = true;
    }

    for (std::string const& lib : llibs) {
      if (this->IsLinkLookupScope(lib, lg)) {
        continue;
      }

      // Skip entries that resolve to the target itself or are empty.
      std::string name = this->CheckCMP0004(lib);
      if (this->GetPolicyStatusCMP0108() == cmPolicies::NEW) {
        // resolve alias name
        auto* target = this->Makefile->FindTargetToUse(name);
        if (target) {
          name = target->GetName();
        }
      }
      if (name == this->GetName() || name.empty()) {
        if (name == this->GetName()) {
          bool noMessage = false;
          MessageType messageType = MessageType::FATAL_ERROR;
          std::ostringstream e;
          switch (this->GetPolicyStatusCMP0038()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0038) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }

          if (!noMessage) {
            e << "Target \"" << this->GetName() << "\" links to itself.";
            this->LocalGenerator->GetCMakeInstance()->IssueMessage(
              messageType, e.str(), this->GetBacktrace());
            if (messageType == MessageType::FATAL_ERROR) {
              return;
            }
          }
        }
        continue;
      }

      // The entry is meant for this configuration.
      cmLinkItem item =
        this->ResolveLinkItem(BT<std::string>(name, entry.Backtrace), lg);
      if (!item.Target) {
        // Report explicitly linked object files separately.
        std::string const& maybeObj = item.AsStr();
        if (cmSystemTools::FileIsFullPath(maybeObj)) {
          cmSourceFile const* sf =
            mf->GetSource(maybeObj, cmSourceFileLocationKind::Known);
          if (sf && sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
            impl.Objects.emplace_back(std::move(item));
            continue;
          }
        }
      }

      impl.Libraries.emplace_back(std::move(item), checkCMP0027);
    }

    std::set<std::string> const& seenProps = cge->GetSeenTargetProperties();
    for (std::string const& sp : seenProps) {
      if (!this->GetProperty(sp)) {
        this->LinkImplicitNullProperties.insert(sp);
      }
    }
    cge->GetMaxLanguageStandard(this, this->MaxLanguageStandards);
  }

  // Update the list of direct link dependencies from usage requirements.
  if (head == this) {
    ComputeLinkImplTransitive(this, config, implFor, impl);
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  cmTargetLinkLibraryType linkType =
    CMP0003_ComputeLinkType(config, debugConfigs);
  cmTarget::LinkLibraryVectorType const& oldllibs =
    this->Target->GetOriginalLinkLibraries();
  for (cmTarget::LibraryID const& oldllib : oldllibs) {
    if (oldllib.second != GENERAL_LibraryType && oldllib.second != linkType) {
      std::string name = this->CheckCMP0004(oldllib.first);
      if (name == this->GetName() || name.empty()) {
        continue;
      }
      // Support OLD behavior for CMP0003.
      impl.WrongConfigLibraries.push_back(
        this->ResolveLinkItem(BT<std::string>(name)));
    }
  }
}